

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

ArgumentDirection slang::ast::SemanticFacts::getDirection(TokenKind kind)

{
  ArgumentDirection AVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 < 0xe7) {
    AVar1 = In;
    if (iVar2 == 0xc1) {
      return InOut;
    }
  }
  else {
    if (iVar2 == 0xe7) {
      return Out;
    }
    AVar1 = Ref;
  }
  return AVar1;
}

Assistant:

ArgumentDirection SemanticFacts::getDirection(TokenKind kind) {
    switch (kind) {
        case TokenKind::InputKeyword: return ArgumentDirection::In;
        case TokenKind::InOutKeyword: return ArgumentDirection::InOut;
        case TokenKind::OutputKeyword: return ArgumentDirection::Out;
        case TokenKind::RefKeyword: return ArgumentDirection::Ref;
        default: SLANG_UNREACHABLE;
    }
}